

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sharedobject.cpp
# Opt level: O2

void __thiscall icu_63::SharedObject::removeRef(SharedObject *this)

{
  u_atomic_int32_t *puVar1;
  UnifiedCacheBase *pUVar2;
  
  pUVar2 = this->cachePtr;
  LOCK();
  puVar1 = &this->hardRefCount;
  (puVar1->super___atomic_base<int>)._M_i = (puVar1->super___atomic_base<int>)._M_i + -1;
  UNLOCK();
  if ((puVar1->super___atomic_base<int>)._M_i != 0) {
    return;
  }
  if (pUVar2 != (UnifiedCacheBase *)0x0) {
    (*(pUVar2->super_UObject)._vptr_UObject[3])(pUVar2);
    return;
  }
  (*(this->super_UObject)._vptr_UObject[1])();
  return;
}

Assistant:

void
SharedObject::removeRef() const {
    const UnifiedCacheBase *cache = this->cachePtr;
    int32_t updatedRefCount = umtx_atomic_dec(&hardRefCount);
    U_ASSERT(updatedRefCount >= 0);
    if (updatedRefCount == 0) {
        if (cache) {
            cache->handleUnreferencedObject();
        } else {
            delete this;
        }
    }
}